

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::SharedDtor(MeanSquaredErrorLossLayer *this)

{
  string *psVar1;
  MeanSquaredErrorLossLayer *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->input_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->target_,psVar1);
  return;
}

Assistant:

void MeanSquaredErrorLossLayer::SharedDtor() {
  input_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  target_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}